

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printValueTree(FILE *fout,Value *value,string *path)

{
  bool bVar1;
  ValueType VVar2;
  ArrayIndex AVar3;
  undefined8 uVar4;
  reference pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  Value *in_RDX;
  Value *in_RSI;
  FILE *in_RDI;
  string *name;
  iterator it;
  string suffix;
  Members members;
  int index;
  int size;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffd78;
  FILE *__lhs;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffd80;
  Value *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  FILE *pFVar8;
  undefined8 in_stack_fffffffffffffda0;
  undefined1 *puVar9;
  CommentPlacement placement;
  char *in_stack_fffffffffffffda8;
  LargestUInt in_stack_fffffffffffffdc8;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  double in_stack_fffffffffffffe98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  undefined1 local_149 [49];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  undefined1 local_108 [36];
  int in_stack_ffffffffffffff1c;
  Value *in_stack_ffffffffffffff20;
  Value *in_stack_ffffffffffffff28;
  Value *in_stack_ffffffffffffff38;
  uint local_c0;
  string local_b8 [32];
  string local_98 [32];
  Value *in_stack_ffffffffffffff88;
  Value *in_stack_ffffffffffffff98;
  string local_58 [32];
  string local_38 [24];
  string *in_stack_ffffffffffffffe0;
  
  bVar1 = Json::Value::hasComment(in_RSI,commentBefore);
  if (bVar1) {
    Json::Value::getComment_abi_cxx11_
              ((Value *)in_stack_fffffffffffffda8,
               (CommentPlacement)((ulong)in_stack_fffffffffffffda0 >> 0x20));
    uVar7 = std::__cxx11::string::c_str();
    fprintf(in_RDI,"%s\n",uVar7);
    std::__cxx11::string::~string(local_38);
  }
  VVar2 = Json::Value::type(in_RSI);
  placement = (CommentPlacement)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  switch(VVar2) {
  case nullValue:
    uVar7 = std::__cxx11::string::c_str();
    fprintf(in_RDI,"%s=null\n",uVar7);
    break;
  case intValue:
    uVar7 = std::__cxx11::string::c_str();
    Json::Value::asLargestInt((Value *)0x12a013);
    Json::valueToString_abi_cxx11_(in_stack_fffffffffffffdc8);
    uVar4 = std::__cxx11::string::c_str();
    fprintf(in_RDI,"%s=%s\n",uVar7,uVar4);
    std::__cxx11::string::~string(local_58);
    break;
  case uintValue:
    uVar7 = std::__cxx11::string::c_str();
    Json::Value::asLargestUInt((Value *)0x12a095);
    Json::valueToString_abi_cxx11_(in_stack_fffffffffffffdc8);
    uVar4 = std::__cxx11::string::c_str();
    fprintf(in_RDI,"%s=%s\n",uVar7,uVar4);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
    break;
  case realValue:
    uVar7 = std::__cxx11::string::c_str();
    Json::Value::asDouble(in_stack_ffffffffffffff38);
    normalizeFloatingPointStr_abi_cxx11_(in_stack_fffffffffffffe98);
    uVar4 = std::__cxx11::string::c_str();
    fprintf(in_RDI,"%s=%s\n",uVar7,uVar4);
    std::__cxx11::string::~string(local_98);
    break;
  case stringValue:
    uVar7 = std::__cxx11::string::c_str();
    Json::Value::asString_abi_cxx11_(in_stack_ffffffffffffff88);
    uVar4 = std::__cxx11::string::c_str();
    fprintf(in_RDI,"%s=\"%s\"\n",uVar7,uVar4);
    std::__cxx11::string::~string(local_b8);
    break;
  case booleanValue:
    uVar7 = std::__cxx11::string::c_str();
    bVar1 = Json::Value::asBool(in_stack_ffffffffffffff28);
    pcVar6 = "false";
    if (bVar1) {
      pcVar6 = "true";
    }
    fprintf(in_RDI,"%s=%s\n",uVar7,pcVar6);
    break;
  case arrayValue:
    pFVar8 = in_RDI;
    uVar7 = std::__cxx11::string::c_str();
    fprintf(pFVar8,"%s=[]\n",uVar7);
    AVar3 = Json::Value::size(in_stack_fffffffffffffd88);
    for (local_c0 = 0; placement = (CommentPlacement)((ulong)in_stack_fffffffffffffda0 >> 0x20),
        (int)local_c0 < (int)AVar3; local_c0 = local_c0 + 1) {
      in_stack_fffffffffffffda8 = printValueTree::buffer;
      snprintf(printValueTree::buffer,0x10,"[%d]",(ulong)local_c0);
      Json::Value::operator[](in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      std::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      printValueTree((FILE *)in_RSI,in_RDX,in_stack_ffffffffffffffe0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
    }
    break;
  case objectValue:
    pFVar8 = in_RDI;
    uVar7 = std::__cxx11::string::c_str();
    fprintf(pFVar8,"%s={}\n",uVar7);
    puVar9 = local_108;
    Json::Value::getMemberNames_abi_cxx11_(in_stack_ffffffffffffff98);
    local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(in_stack_fffffffffffffd68);
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(in_stack_fffffffffffffd68);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    local_149._1_8_ = std::__cxx11::string::end();
    local_149._9_8_ =
         __gnu_cxx::
         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator-((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffd78._M_current,
                     (difference_type)in_stack_fffffffffffffd70);
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_149 + 9));
    pcVar6 = ".";
    if (*pcVar5 == '.') {
      pcVar6 = "";
    }
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_149 + 0x11),pcVar6,(allocator *)__rhs);
    std::allocator<char>::~allocator((allocator<char> *)local_149);
    local_158._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffd68);
    while( true ) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(in_stack_fffffffffffffd68);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffd70,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffd68);
      placement = (CommentPlacement)((ulong)puVar9 >> 0x20);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_158);
      __lhs = in_RDI;
      in_stack_fffffffffffffd80._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Json::Value::operator[](in_stack_fffffffffffffd80._M_current,(string *)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar8,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     in_stack_fffffffffffffd70);
      printValueTree((FILE *)in_RSI,in_RDX,in_stack_ffffffffffffffe0);
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::~string(local_1a8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_158);
    }
    std::__cxx11::string::~string((string *)(local_149 + 0x11));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd80._M_current);
  }
  bVar1 = Json::Value::hasComment(in_RSI,commentAfter);
  if (bVar1) {
    Json::Value::getComment_abi_cxx11_((Value *)in_stack_fffffffffffffda8,placement);
    uVar7 = std::__cxx11::string::c_str();
    fprintf(in_RDI,"%s\n",uVar7);
    std::__cxx11::string::~string(local_1c8);
  }
  return;
}

Assistant:

static void
printValueTree(FILE* fout, Json::Value& value, const std::string& path = ".") {
  if (value.hasComment(Json::commentBefore)) {
    fprintf(fout, "%s\n", value.getComment(Json::commentBefore).c_str());
  }
  switch (value.type()) {
  case Json::nullValue:
    fprintf(fout, "%s=null\n", path.c_str());
    break;
  case Json::intValue:
    fprintf(fout,
            "%s=%s\n",
            path.c_str(),
            Json::valueToString(value.asLargestInt()).c_str());
    break;
  case Json::uintValue:
    fprintf(fout,
            "%s=%s\n",
            path.c_str(),
            Json::valueToString(value.asLargestUInt()).c_str());
    break;
  case Json::realValue:
    fprintf(fout,
            "%s=%s\n",
            path.c_str(),
            normalizeFloatingPointStr(value.asDouble()).c_str());
    break;
  case Json::stringValue:
    fprintf(fout, "%s=\"%s\"\n", path.c_str(), value.asString().c_str());
    break;
  case Json::booleanValue:
    fprintf(fout, "%s=%s\n", path.c_str(), value.asBool() ? "true" : "false");
    break;
  case Json::arrayValue: {
    fprintf(fout, "%s=[]\n", path.c_str());
    int size = value.size();
    for (int index = 0; index < size; ++index) {
      static char buffer[16];
#if defined(_MSC_VER) && defined(__STDC_SECURE_LIB__)
      sprintf_s(buffer, sizeof(buffer), "[%d]", index);
#else
      snprintf(buffer, sizeof(buffer), "[%d]", index);
#endif
      printValueTree(fout, value[index], path + buffer);
    }
  } break;
  case Json::objectValue: {
    fprintf(fout, "%s={}\n", path.c_str());
    Json::Value::Members members(value.getMemberNames());
    std::sort(members.begin(), members.end());
    std::string suffix = *(path.end() - 1) == '.' ? "" : ".";
    for (Json::Value::Members::iterator it = members.begin();
         it != members.end();
         ++it) {
      const std::string& name = *it;
      printValueTree(fout, value[name], path + suffix + name);
    }
  } break;
  default:
    break;
  }

  if (value.hasComment(Json::commentAfter)) {
    fprintf(fout, "%s\n", value.getComment(Json::commentAfter).c_str());
  }
}